

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int urlpart(per_transfer *per,writeoutid vid,char **contentp)

{
  int iVar1;
  char *local_48;
  char *url;
  char *part;
  CURLUPart cpart;
  int rc;
  CURLU *uh;
  char **contentp_local;
  per_transfer *ppStack_18;
  writeoutid vid_local;
  per_transfer *per_local;
  
  uh = (CURLU *)contentp;
  contentp_local._4_4_ = vid;
  ppStack_18 = per;
  _cpart = curl_url();
  part._4_4_ = 0;
  if (_cpart == 0) {
    per_local._4_4_ = 1;
  }
  else {
    part._0_4_ = 5;
    url = (char *)0x0;
    local_48 = (char *)0x0;
    if (contentp_local._4_4_ < VAR_INPUT_URLESCHEME) {
      local_48 = ppStack_18->url;
    }
    else {
      iVar1 = curl_easy_getinfo(ppStack_18->curl,0x100001,&local_48);
      if (iVar1 != 0) {
        part._4_4_ = 5;
      }
    }
    if (part._4_4_ == 0) {
      switch(contentp_local._4_4_) {
      case VAR_INPUT_URLSCHEME:
      case VAR_INPUT_URLESCHEME:
        part._0_4_ = 1;
        break;
      case VAR_INPUT_URLUSER:
      case VAR_INPUT_URLEUSER:
        part._0_4_ = 2;
        break;
      case VAR_INPUT_URLPASSWORD:
      case VAR_INPUT_URLEPASSWORD:
        part._0_4_ = 3;
        break;
      case VAR_INPUT_URLOPTIONS:
      case VAR_INPUT_URLEOPTIONS:
        part._0_4_ = 4;
        break;
      case VAR_INPUT_URLHOST:
      case VAR_INPUT_URLEHOST:
        part._0_4_ = 5;
        break;
      case VAR_INPUT_URLPORT:
      case VAR_INPUT_URLEPORT:
        part._0_4_ = 6;
        break;
      case VAR_INPUT_URLPATH:
      case VAR_INPUT_URLEPATH:
        part._0_4_ = 7;
        break;
      case VAR_INPUT_URLQUERY:
      case VAR_INPUT_URLEQUERY:
        part._0_4_ = 8;
        break;
      case VAR_INPUT_URLFRAGMENT:
      case VAR_INPUT_URLEFRAGMENT:
        part._0_4_ = 9;
        break;
      case VAR_INPUT_URLZONEID:
      case VAR_INPUT_URLEZONEID:
        part._0_4_ = 10;
        break;
      default:
        part._4_4_ = 4;
      }
    }
    if ((part._4_4_ == 0) && (iVar1 = curl_url_set(_cpart,0,local_48,0x208), iVar1 != 0)) {
      part._4_4_ = 2;
    }
    if ((part._4_4_ == 0) && (iVar1 = curl_url_get(_cpart,part._0_4_,&url,1), iVar1 != 0)) {
      part._4_4_ = 3;
    }
    if ((part._4_4_ == 0) && (url != (char *)0x0)) {
      *(char **)uh = url;
    }
    curl_url_cleanup(_cpart);
    per_local._4_4_ = part._4_4_;
  }
  return per_local._4_4_;
}

Assistant:

static int urlpart(struct per_transfer *per, writeoutid vid,
                   const char **contentp)
{
  CURLU *uh = curl_url();
  int rc = 0;
  if(uh) {
    CURLUPart cpart = CURLUPART_HOST;
    char *part = NULL;
    const char *url = NULL;

    if(vid >= VAR_INPUT_URLESCHEME) {
      if(curl_easy_getinfo(per->curl, CURLINFO_EFFECTIVE_URL, &url))
        rc = 5;
    }
    else
      url = per->url;

    if(!rc) {
      switch(vid) {
      case VAR_INPUT_URLSCHEME:
      case VAR_INPUT_URLESCHEME:
        cpart = CURLUPART_SCHEME;
        break;
      case VAR_INPUT_URLUSER:
      case VAR_INPUT_URLEUSER:
        cpart = CURLUPART_USER;
        break;
      case VAR_INPUT_URLPASSWORD:
      case VAR_INPUT_URLEPASSWORD:
        cpart = CURLUPART_PASSWORD;
        break;
      case VAR_INPUT_URLOPTIONS:
      case VAR_INPUT_URLEOPTIONS:
        cpart = CURLUPART_OPTIONS;
        break;
      case VAR_INPUT_URLHOST:
      case VAR_INPUT_URLEHOST:
        cpart = CURLUPART_HOST;
        break;
      case VAR_INPUT_URLPORT:
      case VAR_INPUT_URLEPORT:
        cpart = CURLUPART_PORT;
        break;
      case VAR_INPUT_URLPATH:
      case VAR_INPUT_URLEPATH:
        cpart = CURLUPART_PATH;
        break;
      case VAR_INPUT_URLQUERY:
      case VAR_INPUT_URLEQUERY:
        cpart = CURLUPART_QUERY;
        break;
      case VAR_INPUT_URLFRAGMENT:
      case VAR_INPUT_URLEFRAGMENT:
        cpart = CURLUPART_FRAGMENT;
        break;
      case VAR_INPUT_URLZONEID:
      case VAR_INPUT_URLEZONEID:
        cpart = CURLUPART_ZONEID;
        break;
      default:
        /* not implemented */
        rc = 4;
        break;
      }
    }
    if(!rc && curl_url_set(uh, CURLUPART_URL, url,
                           CURLU_GUESS_SCHEME|CURLU_NON_SUPPORT_SCHEME))
      rc = 2;

    if(!rc && curl_url_get(uh, cpart, &part, CURLU_DEFAULT_PORT))
      rc = 3;

    if(!rc && part)
      *contentp = part;
    curl_url_cleanup(uh);
  }
  else
    return 1;
  return rc;
}